

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common-test.c++
# Opt level: O0

void __thiscall kj::parse::anon_unknown_0::TestCase228::TestCase228(TestCase228 *this)

{
  TestCase228 *this_local;
  
  TestCase::TestCase(&this->super_TestCase,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++"
                     ,0xe4,"legacy test: CommonParsers/TimesParser");
  (this->super_TestCase)._vptr_TestCase = (_func_int **)&PTR_run_007cc908;
  return;
}

Assistant:

TEST(CommonParsers, TimesParser) {
  StringPtr text = "foobar";

  auto parser = sequence(exactly('f'), times(any, 4));

  {
    Input input(text.begin(), text.begin() + 4);
    Maybe<Array<char>> result = parser(input);
    EXPECT_TRUE(result == nullptr);
    EXPECT_TRUE(input.atEnd());
  }

  {
    Input input(text.begin(), text.begin() + 5);
    Maybe<Array<char>> result = parser(input);
    KJ_IF_MAYBE(s, result) {
      EXPECT_EQ("ooba", heapString(*s));
    } else {
      ADD_FAILURE() << "Expected string, got null.";
    }
    EXPECT_TRUE(input.atEnd());
  }